

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

XML_Convert_Result
unknown_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  unsigned_short *puVar1;
  int iVar2;
  bool bVar3;
  unsigned_short local_42;
  unsigned_short c;
  unknown_encoding *uenc;
  unsigned_short *toLim_local;
  unsigned_short **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  while( true ) {
    bVar3 = false;
    if (*fromP < fromLim) {
      bVar3 = *toP < toLim;
    }
    if (!bVar3) break;
    local_42 = *(unsigned_short *)((long)enc[3].literalScanners + (ulong)(byte)**fromP * 2 + 0x30);
    if (local_42 == 0) {
      iVar2 = (*enc[3].nameLength)((ENCODING *)enc[3].skipS,*fromP);
      local_42 = (unsigned_short)iVar2;
      *fromP = *fromP + (int)(*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3);
    }
    else {
      *fromP = *fromP + 1;
    }
    puVar1 = *toP;
    *toP = puVar1 + 1;
    *puVar1 = local_42;
  }
  if ((*toP == toLim) && (*fromP < fromLim)) {
    enc_local._4_4_ = XML_CONVERT_OUTPUT_EXHAUSTED;
  }
  else {
    enc_local._4_4_ = XML_CONVERT_COMPLETED;
  }
  return enc_local._4_4_;
}

Assistant:

static enum XML_Convert_Result PTRCALL
unknown_toUtf16(const ENCODING *enc,
                const char **fromP, const char *fromLim,
                unsigned short **toP, const unsigned short *toLim)
{
  const struct unknown_encoding *uenc = AS_UNKNOWN_ENCODING(enc);
  while (*fromP < fromLim && *toP < toLim) {
    unsigned short c = uenc->utf16[(unsigned char)**fromP];
    if (c == 0) {
      c = (unsigned short)
          uenc->convert(uenc->userData, *fromP);
      *fromP += (AS_NORMAL_ENCODING(enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2));
    }
    else
      (*fromP)++;
    *(*toP)++ = c;
  }

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}